

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectType_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectType_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  void *pvVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  SimpleString local_a0;
  TypeForTestingExpectedFunctionCall type;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  MockNamedValue local_68;
  
  comparator.super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (MockNamedValueComparator)&PTR__MockNamedValueComparator_002c01f8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
  SimpleString::SimpleString((SimpleString *)&local_68,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            (&repository,(SimpleString *)&local_68,&comparator.super_MockNamedValueComparator);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&type,1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString((SimpleString *)&local_68,"type");
  SimpleString::SimpleString(&local_a0,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_68,&local_a0,&type);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_a0,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_68,pMVar1,&local_a0);
  pvVar3 = MockNamedValue::getConstObjectPointer(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,&type,pvVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x18e,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  SimpleString::~SimpleString(&local_a0);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_a0,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_68,pMVar1,&local_a0);
  pcVar5 = SimpleString::asCharString((SimpleString *)&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"1",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,399,pTVar4);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::~SimpleString(&local_a0);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&type);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectType)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1);
    call->withParameterOfType("type", "name", &type);
    POINTERS_EQUAL(&type, call->getInputParameter("name").getConstObjectPointer());
    STRCMP_EQUAL("1", call->getInputParameterValueString("name").asCharString());
}